

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O1

void ymz280b_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte *pbVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  DEV_SMPL *pDVar5;
  DEV_SMPL *pDVar6;
  byte bVar7;
  ushort uVar8;
  int iVar9;
  ulong uVar10;
  code *pcVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  char *pcVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  undefined8 uVar23;
  ushort uVar24;
  undefined8 uVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  ushort *puVar29;
  int iVar30;
  ymz280b_state *chip;
  ushort local_76;
  
  pDVar5 = *outputs;
  pDVar6 = outputs[1];
  uVar10 = (ulong)samples;
  memset(pDVar5,0,uVar10 * 4);
  memset(pDVar6,0,uVar10 * 4);
  if (*(long *)((long)param + 0x2d0) == 0) {
    return;
  }
  lVar17 = 0;
LAB_00154e1a:
  lVar15 = lVar17 * 0x4c;
  if (*(char *)((long)param + lVar15 + 0x69) == '\0') {
    pbVar1 = (byte *)((long)param + lVar15 + 0x20);
    local_76 = *(ushort *)((long)param + lVar15 + 0x66);
    sVar2 = *(short *)(pbVar1 + 0x44);
    bVar7 = *pbVar1;
    if ((local_76 == 0 && bVar7 == 0) && sVar2 == 0) {
      pbVar1[0x40] = 0;
      pbVar1[0x41] = 0x40;
      pbVar1[0x42] = 0;
      pbVar1[0x43] = 0;
      goto LAB_00155574;
    }
    puVar29 = *(ushort **)((long)param + 0x2e0);
    iVar3 = *(int *)((long)param + lVar15 + 0x54);
    iVar4 = *(int *)((long)param + lVar15 + 0x58);
    if (samples == 0) {
      uVar18 = 0;
    }
    else {
      uVar21 = 0;
      do {
        iVar22 = *(int *)(pbVar1 + 0x40);
        uVar18 = uVar21;
        if (0x3fff < iVar22) break;
        iVar22 = iVar22 * (short)local_76 + (0x4000 - iVar22) * (int)sVar2 >> 0xe;
        pDVar5[uVar21] = pDVar5[uVar21] + iVar22 * iVar3;
        pDVar6[uVar21] = pDVar6[uVar21] + iVar22 * iVar4;
        *(int *)(pbVar1 + 0x40) = *(int *)(pbVar1 + 0x40) + *(int *)(pbVar1 + 0x3c);
        uVar21 = uVar21 + 1;
        uVar18 = uVar10;
      } while (uVar10 != uVar21);
    }
    iVar22 = *(int *)(pbVar1 + 0x40);
    if (iVar22 < 0x4000) goto LAB_00155574;
    *(int *)(pbVar1 + 0x40) = iVar22 + -0x4000;
    uVar16 = (samples - (uint)uVar18) * *(int *)(pbVar1 + 0x3c) + iVar22 >> 0xe;
    uVar20 = 10000;
    if (uVar16 < 10000) {
      uVar20 = uVar16;
    }
    uVar12 = (uint)pbVar1[4] | (uint)bVar7 << 7;
    if (uVar12 == 0x83) {
      uVar12 = *(uint *)(pbVar1 + 0x1c);
      if (pbVar1[3] == 0) {
        uVar14 = 10000;
        if (uVar16 < 10000) {
          uVar14 = uVar16;
        }
        lVar15 = 0;
        do {
          if (uVar14 == (uint)lVar15) goto LAB_0015530b;
          uVar13 = uVar12 >> 1 & 0xffffff;
          if (uVar13 < *(uint *)((long)param + 0x2d8)) {
            uVar8 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar13) << 8;
          }
          else {
            uVar8 = 0;
          }
          uVar13 = (uVar12 >> 1) + 1 & 0xffffff;
          if (uVar13 < *(uint *)((long)param + 0x2d8)) {
            uVar24 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar13);
          }
          else {
            uVar24 = 0;
          }
          puVar29[lVar15] = uVar24 | uVar8;
          uVar12 = uVar12 + 4;
          lVar15 = lVar15 + 1;
        } while (uVar12 < *(uint *)(pbVar1 + 0x10));
      }
      else {
        uVar14 = 10000;
        if (uVar16 < 10000) {
          uVar14 = uVar16;
        }
        lVar15 = 0;
        do {
          if (uVar14 == (uint)lVar15) goto LAB_0015530b;
          uVar13 = uVar12 >> 1 & 0xffffff;
          if (uVar13 < *(uint *)((long)param + 0x2d8)) {
            uVar8 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar13) << 8;
          }
          else {
            uVar8 = 0;
          }
          uVar13 = (uVar12 >> 1) + 1 & 0xffffff;
          if (uVar13 < *(uint *)((long)param + 0x2d8)) {
            uVar24 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar13);
          }
          else {
            uVar24 = 0;
          }
          puVar29[lVar15] = uVar24 | uVar8;
          uVar12 = uVar12 + 4;
          if ((*(uint *)(pbVar1 + 0x18) <= uVar12) && (pbVar1[2] != 0)) {
            uVar12 = *(uint *)(pbVar1 + 0x14);
          }
          lVar15 = lVar15 + 1;
        } while (uVar12 < *(uint *)(pbVar1 + 0x10));
      }
      iVar22 = (int)lVar15;
      if (9999 < uVar16) {
        uVar16 = 10000;
      }
LAB_00155302:
      uVar21 = (ulong)(uVar16 - iVar22);
      pbVar1[1] = 1;
      goto LAB_0015530d;
    }
    if (uVar12 == 0x82) {
      uVar12 = *(uint *)(pbVar1 + 0x1c);
      if (pbVar1[3] == 0) {
        uVar14 = 10000;
        if (uVar16 < 10000) {
          uVar14 = uVar16;
        }
        lVar15 = 0;
        do {
          if (uVar14 == (uint)lVar15) goto LAB_0015530b;
          uVar13 = uVar12 >> 1 & 0xffffff;
          if (uVar13 < *(uint *)((long)param + 0x2d8)) {
            uVar8 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar13) << 8;
          }
          else {
            uVar8 = 0;
          }
          puVar29[lVar15] = uVar8;
          uVar12 = uVar12 + 2;
          lVar15 = lVar15 + 1;
        } while (uVar12 < *(uint *)(pbVar1 + 0x10));
      }
      else {
        uVar14 = 10000;
        if (uVar16 < 10000) {
          uVar14 = uVar16;
        }
        lVar15 = 0;
        do {
          if (uVar14 == (uint)lVar15) goto LAB_0015530b;
          uVar13 = uVar12 >> 1 & 0xffffff;
          if (uVar13 < *(uint *)((long)param + 0x2d8)) {
            uVar8 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar13) << 8;
          }
          else {
            uVar8 = 0;
          }
          puVar29[lVar15] = uVar8;
          uVar12 = uVar12 + 2;
          if ((*(uint *)(pbVar1 + 0x18) <= uVar12) && (pbVar1[2] != 0)) {
            uVar12 = *(uint *)(pbVar1 + 0x14);
          }
          lVar15 = lVar15 + 1;
        } while (uVar12 < *(uint *)(pbVar1 + 0x10));
      }
      iVar22 = (int)lVar15;
      if (9999 < uVar16) {
        uVar16 = 10000;
      }
      goto LAB_00155302;
    }
    if (uVar12 == 0x81) {
      uVar12 = *(uint *)(pbVar1 + 0x1c);
      uVar21 = (ulong)uVar12;
      iVar22 = *(int *)(pbVar1 + 0x20);
      iVar9 = *(int *)(pbVar1 + 0x24);
      if (pbVar1[3] == 0) {
        uVar14 = 10000;
        if (uVar16 < 10000) {
          uVar14 = uVar16;
        }
        iVar27 = uVar12 << 2;
        lVar15 = 0;
        do {
          if (uVar14 == (uint)lVar15) {
            uVar12 = (uint)lVar15 + uVar12;
            goto LAB_00155442;
          }
          uVar13 = (uint)(uVar21 + lVar15 >> 1) & 0xffffff;
          uVar26 = 0;
          if (uVar13 < *(uint *)((long)param + 0x2d8)) {
            uVar26 = (uint)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar13);
          }
          uVar26 = uVar26 >> (~(byte)iVar27 & 4);
          iVar22 = iVar22 * 0xfe;
          iVar28 = iVar22 + 0xff;
          if (-1 < iVar22) {
            iVar28 = iVar22;
          }
          iVar30 = diff_lookup[uVar26 & 0xf] * iVar9;
          iVar22 = iVar30 + 7;
          if (-1 < iVar30) {
            iVar22 = iVar30;
          }
          iVar22 = (iVar22 >> 3) + (iVar28 >> 8);
          if (iVar22 < -0x7fff) {
            iVar22 = -0x8000;
          }
          if (0x7ffe < iVar22) {
            iVar22 = 0x7fff;
          }
          iVar9 = iVar9 * index_scale[uVar26 & 7] >> 8;
          if (iVar9 < 0x80) {
            iVar9 = 0x7f;
          }
          if (0x5fff < iVar9) {
            iVar9 = 0x6000;
          }
          puVar29[lVar15] = (ushort)iVar22;
          lVar15 = lVar15 + 1;
          iVar28 = (int)lVar15;
          iVar27 = iVar27 + 4;
        } while (iVar28 + uVar12 < *(uint *)(pbVar1 + 0x10));
        if (9999 < uVar16) {
          uVar16 = 10000;
        }
        uVar16 = uVar16 - iVar28;
        uVar12 = iVar28 + uVar12;
      }
      else {
        uVar14 = 10000;
        if (uVar16 < 10000) {
          uVar14 = uVar16;
        }
        lVar15 = 0;
        do {
          uVar12 = (uint)uVar21;
          if (uVar14 == (uint)lVar15) goto LAB_00155442;
          uVar13 = (uint)(uVar21 >> 1) & 0xffffff;
          uVar26 = 0;
          if (uVar13 < *(uint *)((long)param + 0x2d8)) {
            uVar26 = (uint)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar13);
          }
          uVar26 = uVar26 >> (~((char)uVar21 * '\x04') & 4U);
          iVar22 = iVar22 * 0xfe;
          iVar27 = iVar22 + 0xff;
          if (-1 < iVar22) {
            iVar27 = iVar22;
          }
          iVar28 = diff_lookup[uVar26 & 0xf] * iVar9;
          iVar22 = iVar28 + 7;
          if (-1 < iVar28) {
            iVar22 = iVar28;
          }
          iVar22 = (iVar22 >> 3) + (iVar27 >> 8);
          if (iVar22 < -0x7fff) {
            iVar22 = -0x8000;
          }
          if (0x7ffe < iVar22) {
            iVar22 = 0x7fff;
          }
          iVar9 = iVar9 * index_scale[uVar26 & 7] >> 8;
          if (iVar9 < 0x80) {
            iVar9 = 0x7f;
          }
          if (0x5fff < iVar9) {
            iVar9 = 0x6000;
          }
          puVar29[lVar15] = (ushort)iVar22;
          uVar12 = uVar12 + 1;
          uVar21 = (ulong)uVar12;
          if ((uVar12 == *(uint *)(pbVar1 + 0x14)) && (*(int *)(pbVar1 + 0x30) == 0)) {
            *(int *)(pbVar1 + 0x28) = iVar22;
            *(int *)(pbVar1 + 0x2c) = iVar9;
          }
          if ((*(uint *)(pbVar1 + 0x18) <= uVar12) && (pbVar1[2] != 0)) {
            iVar22 = *(int *)(pbVar1 + 0x28);
            iVar9 = *(int *)(pbVar1 + 0x2c);
            *(int *)(pbVar1 + 0x30) = *(int *)(pbVar1 + 0x30) + 1;
            uVar21 = (ulong)*(uint *)(pbVar1 + 0x14);
          }
          lVar15 = lVar15 + 1;
          uVar12 = (uint)uVar21;
        } while (uVar12 < *(uint *)(pbVar1 + 0x10));
        if (9999 < uVar16) {
          uVar16 = 10000;
        }
        uVar16 = uVar16 - (int)lVar15;
      }
      uVar21 = (ulong)uVar16;
      pbVar1[1] = 1;
      goto LAB_00155447;
    }
    memset(puVar29,0,(ulong)(uVar20 * 2));
    uVar21 = 0;
    goto LAB_00155456;
  }
  goto LAB_00155574;
LAB_0015530b:
  uVar21 = 0;
LAB_0015530d:
  *(uint *)(pbVar1 + 0x1c) = uVar12;
LAB_00155456:
  uVar16 = (uint)uVar21;
  if ((uVar16 != 0) || (pbVar1[1] != 0)) {
    pbVar1[1] = 0;
    uVar12 = uVar20 - uVar16;
    uVar8 = local_76;
    if (uVar12 != 0) {
      uVar8 = *(ushort *)(*(long *)((long)param + 0x2e0) + (ulong)(uVar12 - 1) * 2);
    }
    uVar14 = (uint)uVar8;
    if (uVar16 != 0) {
      lVar15 = *(long *)((long)param + 0x2e0);
      do {
        uVar13 = (short)uVar14 * 0xf;
        uVar14 = (short)uVar14 * 0xf + 0xf;
        if (-1 < (int)uVar13) {
          uVar14 = uVar13;
        }
        uVar14 = uVar14 >> 4;
        *(short *)(lVar15 + (ulong)uVar12 * 2) = (short)uVar14;
        uVar12 = uVar12 + 1;
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
    }
    if (uVar20 != uVar16) {
      *pbVar1 = 0;
      pbVar1[0x48] = 1;
    }
  }
  uVar8 = *puVar29;
  if ((uint)uVar18 < samples) {
    puVar29 = puVar29 + 1;
    do {
      do {
        iVar22 = *(int *)(pbVar1 + 0x40);
        if (0x3fff < iVar22) break;
        iVar22 = iVar22 * (short)uVar8 + (0x4000 - iVar22) * (int)(short)local_76 >> 0xe;
        pDVar5[uVar18 & 0xffffffff] = pDVar5[uVar18 & 0xffffffff] + iVar22 * iVar3;
        pDVar6[uVar18 & 0xffffffff] = pDVar6[uVar18 & 0xffffffff] + iVar22 * iVar4;
        *(int *)(pbVar1 + 0x40) = *(int *)(pbVar1 + 0x40) + *(int *)(pbVar1 + 0x3c);
        uVar20 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar20;
      } while (uVar20 < samples);
      uVar24 = uVar8;
      if (0x3fff < *(int *)(pbVar1 + 0x40)) {
        *(int *)(pbVar1 + 0x40) = *(int *)(pbVar1 + 0x40) + -0x4000;
        uVar24 = *puVar29;
        puVar29 = puVar29 + 1;
        local_76 = uVar8;
      }
      uVar8 = uVar24;
    } while ((uint)uVar18 < samples);
  }
  *(ushort *)(pbVar1 + 0x44) = local_76;
  *(ushort *)(pbVar1 + 0x46) = uVar8;
LAB_00155574:
  lVar17 = lVar17 + 1;
  if (lVar17 == 8) goto code_r0x00155586;
  goto LAB_00154e1a;
LAB_00155442:
  uVar21 = 0;
LAB_00155447:
  *(uint *)(pbVar1 + 0x1c) = uVar12;
  *(int *)(pbVar1 + 0x20) = iVar22;
  *(int *)(pbVar1 + 0x24) = iVar9;
  goto LAB_00155456;
code_r0x00155586:
  if (samples != 0) {
    pDVar5 = *outputs;
    pDVar6 = outputs[1];
    uVar18 = 0;
    do {
      pDVar5[uVar18] = pDVar5[uVar18] >> 8;
      pDVar6[uVar18] = pDVar6[uVar18] >> 8;
      uVar18 = uVar18 + 1;
    } while (uVar10 != uVar18);
  }
  pcVar19 = (char *)((long)param + 0x68);
  lVar17 = 0;
  do {
    if (*pcVar19 != '\0') {
      pcVar19[-0x48] = '\0';
      bVar7 = (byte)(1 << ((byte)lVar17 & 0x1f)) | *(byte *)((long)param + 0x281);
      *(byte *)((long)param + 0x281) = bVar7;
      if ((*(char *)((long)param + 0x284) == '\0') ||
         ((bVar7 & *(byte *)((long)param + 0x283)) == 0)) {
        if (*(char *)((long)param + 0x282) != '\0') {
          *(undefined1 *)((long)param + 0x282) = 0;
          pcVar11 = *(code **)((long)param + 0x298);
          if (pcVar11 != (code *)0x0) {
            uVar25 = *(undefined8 *)((long)param + 0x2a0);
            uVar23 = 0;
            goto LAB_0015563b;
          }
        }
      }
      else if (*(char *)((long)param + 0x282) == '\0') {
        *(undefined1 *)((long)param + 0x282) = 1;
        pcVar11 = *(code **)((long)param + 0x298);
        if (pcVar11 != (code *)0x0) {
          uVar25 = *(undefined8 *)((long)param + 0x2a0);
          uVar23 = 1;
LAB_0015563b:
          (*pcVar11)(uVar25,uVar23);
        }
      }
      *pcVar19 = '\0';
    }
    lVar17 = lVar17 + 1;
    pcVar19 = pcVar19 + 0x4c;
    if (lVar17 == 8) {
      return;
    }
  } while( true );
}

Assistant:

static void ymz280b_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	ymz280b_state *chip = (ymz280b_state *)param;
	DEV_SMPL *lacc = outputs[0];
	DEV_SMPL *racc = outputs[1];
	UINT8 v;
	UINT32 i;

	/* clear out the accumulator */
	memset(lacc, 0, samples * sizeof(lacc[0]));
	memset(racc, 0, samples * sizeof(racc[0]));
	if (chip->mem_base == NULL)
		return;

	/* loop over voices */
	for (v = 0; v < 8; v++)
	{
		struct YMZ280BVoice *voice = &chip->voice[v];
		INT16 prev = voice->last_sample;
		INT16 curr = voice->curr_sample;
		INT16 *curr_data = chip->scratch;
		INT32 *ldest = lacc;
		INT32 *rdest = racc;
		UINT32 new_samples, samples_left;
		UINT32 final_pos;
		INT32 lvol = voice->output_left;
		INT32 rvol = voice->output_right;
		
		/* skip if muted */
		if (voice->Muted)
			continue;

		/* quick out if we're not playing and we're at 0 */
		if (!voice->playing && curr == 0 && prev == 0)
		{
			/* make sure next sound plays immediately */
			voice->output_pos = FRAC_ONE;

			continue;
		}

		/* finish off the current sample */
		/* interpolate */
		for (i = 0; i < samples && voice->output_pos < FRAC_ONE; i++)
		{
			int interp_sample = (((INT32)prev * (FRAC_ONE - voice->output_pos)) + ((INT32)curr * voice->output_pos)) >> FRAC_BITS;
			ldest[i] += interp_sample * lvol;
			rdest[i] += interp_sample * rvol;
			voice->output_pos += voice->output_step;
		}

		/* if we're over, continue; otherwise, we're done */
		if (voice->output_pos >= FRAC_ONE)
			voice->output_pos -= FRAC_ONE;
		else
			continue;

		/* compute how many new samples we need */
		final_pos = voice->output_pos + (samples - i) * voice->output_step;
		new_samples = (final_pos + FRAC_ONE) >> FRAC_BITS;
		if (new_samples > MAX_SAMPLE_CHUNK)
			new_samples = MAX_SAMPLE_CHUNK;

		/* generate them into our buffer */
		switch (voice->playing << 7 | voice->mode)
		{
			case 0x81:  samples_left = generate_adpcm(chip, voice, chip->scratch, new_samples); break;
			case 0x82:  samples_left = generate_pcm8(chip, voice, chip->scratch, new_samples); break;
			case 0x83:  samples_left = generate_pcm16(chip, voice, chip->scratch, new_samples); break;
			default:    samples_left = 0; memset(chip->scratch, 0, new_samples * sizeof(chip->scratch[0])); break;
		}

		if (samples_left || voice->ended)
		{
			UINT32 base;
			UINT32 j;
			INT16 t;
			
			voice->ended = 0;
			base = new_samples - samples_left;
			t = (base == 0) ? curr : chip->scratch[base - 1];
			
			for (j = 0; j < samples_left; j++)
			{
				t = (t * 15) / 16;
				chip->scratch[base + j] = t;
			}

			/* if we hit the end and IRQs are enabled, signal it */
			if (base != 0)
			{
				voice->playing = 0;

				/* set update_irq_state_timer. IRQ is signaled on next CPU execution. */
				voice->irq_schedule = 1;
			}
		}

		/* advance forward one sample */
		prev = curr;
		curr = *curr_data++;

		/* then sample-rate convert with linear interpolation */
		while (i < samples)
		{
			/* interpolate */
			for (; i < samples && voice->output_pos < FRAC_ONE; i++)
			{
				int interp_sample = (((INT32)prev * (FRAC_ONE - voice->output_pos)) + ((INT32)curr * voice->output_pos)) >> FRAC_BITS;
				ldest[i] += interp_sample * lvol;
				rdest[i] += interp_sample * rvol;
				voice->output_pos += voice->output_step;
			}

			/* if we're over, grab the next samples */
			if (voice->output_pos >= FRAC_ONE)
			{
				voice->output_pos -= FRAC_ONE;
				prev = curr;
				curr = *curr_data++;
			}
		}

		/* remember the last samples */
		voice->last_sample = prev;
		voice->curr_sample = curr;
	}

	for (i = 0; i < samples; i++)
	{
		outputs[0][i] >>= 8;
		outputs[1][i] >>= 8;
	}
	
	for (v = 0; v < 8; v++)
		update_irq_state_timer_common(chip, v);
}